

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dblk_compr.c
# Opt level: O3

UINT8 CompressDataBlk(UINT32 outLen,UINT8 *outData,UINT32 inLen,UINT8 *inData,PCM_CMP_INF *cmprInfo)

{
  byte *pbVar1;
  byte bVar2;
  UINT8 UVar3;
  UINT16 srcLen;
  PCM_COMPR_TBL *pPVar4;
  ushort uVar5;
  ushort uVar6;
  ushort uVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  short sVar11;
  uint uVar12;
  ulong uVar13;
  ushort uVar14;
  ushort uVar15;
  byte bVar16;
  uint uVar17;
  byte bVar18;
  ushort uVar19;
  uint uVar20;
  uint uVar21;
  byte bVar22;
  UINT32 dstLen;
  long lVar23;
  byte bVar24;
  byte bVar25;
  uint uVar26;
  uint uVar27;
  UINT8 *pUVar28;
  ushort *puVar29;
  UINT16 *local_50;
  UINT16 local_38;
  
  if (cmprInfo->comprType != '\0') {
    return 0x80;
  }
  uVar13 = (ulong)outLen;
  bVar18 = cmprInfo->bitsDec;
  uVar8 = bVar18 + 7 >> 3;
  if (uVar8 == 2) {
    lVar23 = 1L << (bVar18 & 0x3f);
    bVar2 = cmprInfo->bitsCmp;
    uVar5 = (ushort)bVar2;
    UVar3 = cmprInfo->subType;
    if (UVar3 != '\x02') {
      uVar6 = cmprInfo->baseVal;
      uVar8 = (uint)((uVar13 << 4) / (ulong)bVar2);
      if (uVar8 < inLen) {
        inLen = uVar8;
      }
      puVar29 = (ushort *)(inData + inLen);
      if (UVar3 == '\0') {
        if (inLen == 0) {
          return '\0';
        }
        uVar8 = (uint)*outData;
        uVar7 = 0;
        do {
          uVar19 = *(ushort *)inData;
          bVar18 = (byte)(-0x100 >> ((byte)uVar7 & 0x1f)) & (byte)uVar8;
          uVar8 = (uint)bVar18;
          *outData = bVar18;
          if (bVar2 == 0) {
            uVar8 = (uint)bVar18;
          }
          else {
            sVar11 = 0;
            uVar14 = uVar5;
            do {
              uVar15 = 8;
              if (uVar14 < 8) {
                uVar15 = uVar14;
              }
              uVar7 = uVar7 + uVar15;
              uVar27 = ((uint)uVar19 - (uint)uVar6 >> ((byte)sVar11 & 0x1f) & 0xffff &
                       ~(-1 << ((byte)uVar15 & 0x1f))) << 8;
              bVar18 = (byte)(uVar27 >> ((byte)uVar7 & 0x1f)) | (byte)uVar8;
              uVar8 = (uint)bVar18;
              *outData = bVar18;
              if (7 < uVar7) {
                uVar7 = uVar7 - 8;
                uVar8 = uVar27 >> ((byte)uVar7 & 0x1f);
                outData[1] = (byte)uVar8;
                outData = outData + 1;
              }
              uVar14 = uVar14 - uVar15;
              sVar11 = sVar11 + uVar15;
            } while (uVar14 != 0);
          }
          inData = (UINT8 *)((long)inData + 2);
        } while (inData < puVar29);
        return '\0';
      }
      if (UVar3 != '\x01') {
        return '\0';
      }
      if (inLen == 0) {
        return '\0';
      }
      uVar8 = (uint)*outData;
      uVar7 = 0;
      do {
        uVar19 = *(ushort *)inData;
        bVar22 = (byte)(-0x100 >> ((byte)uVar7 & 0x1f)) & (byte)uVar8;
        uVar8 = (uint)bVar22;
        *outData = bVar22;
        if (bVar2 == 0) {
          uVar8 = (uint)bVar22;
        }
        else {
          sVar11 = 0;
          uVar14 = uVar5;
          do {
            uVar15 = 8;
            if (uVar14 < 8) {
              uVar15 = uVar14;
            }
            uVar7 = uVar7 + uVar15;
            uVar27 = (((uint)uVar19 - (uint)uVar6 >> (bVar18 - bVar2 & 0x1f)) >>
                      ((byte)sVar11 & 0x1f) & 0xffff & ~(-1 << ((byte)uVar15 & 0x1f))) << 8;
            bVar22 = (byte)(uVar27 >> ((byte)uVar7 & 0x1f)) | (byte)uVar8;
            uVar8 = (uint)bVar22;
            *outData = bVar22;
            if (7 < uVar7) {
              uVar7 = uVar7 - 8;
              uVar8 = uVar27 >> ((byte)uVar7 & 0x1f);
              outData[1] = (byte)uVar8;
              outData = outData + 1;
            }
            uVar14 = uVar14 - uVar15;
            sVar11 = sVar11 + uVar15;
          } while (uVar14 != 0);
        }
        inData = (UINT8 *)((long)inData + 2);
      } while (inData < puVar29);
      return '\0';
    }
    pPVar4 = cmprInfo->comprTbl;
    uVar6 = pPVar4->valueCount;
    if (uVar6 == 0) {
      return '\x10';
    }
    if (bVar18 != pPVar4->bitsDec) {
      return '\x11';
    }
    if (bVar2 != pPVar4->bitsCmp) {
      return '\x11';
    }
    local_50 = (UINT16 *)malloc(lVar23 * 2);
    dstLen = (UINT32)lVar23;
    GenerateReverseLUT_16(dstLen,local_50,(uint)uVar6,(pPVar4->values).d16);
    uVar8 = (uint)((uVar13 << 4) / (ulong)bVar2);
    if (uVar8 < inLen) {
      inLen = uVar8;
    }
    if (inLen != 0) {
      puVar29 = (ushort *)(inData + inLen);
      uVar8 = (uint)*outData;
      uVar6 = 0;
      do {
        bVar18 = (byte)(-0x100 >> ((byte)uVar6 & 0x1f)) & (byte)uVar8;
        uVar8 = (uint)bVar18;
        uVar7 = local_50[(uint)*(ushort *)inData & dstLen + 0xffff];
        *outData = bVar18;
        if (bVar2 == 0) {
          uVar8 = (uint)bVar18;
        }
        else {
          sVar11 = 0;
          uVar19 = uVar5;
          do {
            uVar14 = 8;
            if (uVar19 < 8) {
              uVar14 = uVar19;
            }
            uVar6 = uVar6 + uVar14;
            uVar27 = ((uint)(uVar7 >> ((byte)sVar11 & 0x1f)) & ~(-1 << ((byte)uVar14 & 0x1f))) << 8;
            bVar18 = (byte)(uVar27 >> ((byte)uVar6 & 0x1f)) | (byte)uVar8;
            uVar8 = (uint)bVar18;
            *outData = bVar18;
            if (7 < uVar6) {
              uVar6 = uVar6 - 8;
              uVar8 = uVar27 >> ((byte)uVar6 & 0x1f);
              outData[1] = (byte)uVar8;
              outData = outData + 1;
            }
            uVar19 = uVar19 - uVar14;
            sVar11 = sVar11 + uVar14;
          } while (uVar19 != 0);
        }
        inData = (UINT8 *)((long)inData + 2);
      } while (inData < puVar29);
    }
  }
  else {
    if (uVar8 != 1) {
      return ' ';
    }
    uVar10 = 1L << (bVar18 & 0x3f);
    bVar2 = cmprInfo->bitsCmp;
    uVar8 = (uint)bVar2;
    UVar3 = cmprInfo->subType;
    if (UVar3 != '\x02') {
      bVar22 = (byte)cmprInfo->baseVal;
      uVar27 = (uint)((uVar13 << 3) / (ulong)bVar2);
      if (uVar27 < inLen) {
        inLen = uVar27;
      }
      pbVar1 = inData + inLen;
      if (UVar3 == '\0') {
        if (inLen == 0) {
          return '\0';
        }
        uVar27 = (uint)*outData;
        iVar9 = 0;
        do {
          bVar25 = (byte)(-0x100 >> ((byte)iVar9 & 0x1f)) & (byte)uVar27;
          uVar27 = (uint)bVar25;
          bVar18 = *inData;
          *outData = bVar25;
          if (bVar2 == 0) {
            uVar27 = (uint)bVar25;
          }
          else {
            uVar17 = 0;
            uVar21 = uVar8;
            do {
              uVar12 = 8;
              if ((ushort)uVar21 < 8) {
                uVar12 = uVar21;
              }
              iVar9 = iVar9 + uVar12;
              uVar26 = (((uint)bVar18 - (uint)bVar22 & 0xffff) >> ((byte)uVar17 & 0x1f) &
                       ~(-1 << ((byte)uVar12 & 0x1f))) << 8;
              bVar25 = (byte)(uVar26 >> ((byte)iVar9 & 0x1f)) | (byte)uVar27;
              uVar27 = (uint)bVar25;
              *outData = bVar25;
              if (7 < (ushort)iVar9) {
                iVar9 = iVar9 + -8;
                uVar27 = uVar26 >> ((byte)iVar9 & 0x1f);
                outData[1] = (byte)uVar27;
                outData = outData + 1;
              }
              uVar21 = uVar21 - uVar12;
              uVar17 = (uVar17 & 0xffff) + (uVar12 & 0xffff);
            } while ((short)uVar21 != 0);
          }
          inData = inData + 1;
        } while (inData < pbVar1);
        return '\0';
      }
      if (UVar3 != '\x01') {
        return '\0';
      }
      if (inLen == 0) {
        return '\0';
      }
      uVar27 = (uint)*outData;
      iVar9 = 0;
      do {
        bVar16 = (byte)(-0x100 >> ((byte)iVar9 & 0x1f)) & (byte)uVar27;
        uVar27 = (uint)bVar16;
        bVar25 = *inData;
        *outData = bVar16;
        if (bVar2 == 0) {
          uVar27 = (uint)bVar16;
        }
        else {
          bVar16 = bVar18 - bVar2 & 0x1f;
          uVar17 = 0 >> bVar16;
          uVar21 = uVar8;
          do {
            uVar12 = 8;
            if ((ushort)uVar21 < 8) {
              uVar12 = uVar21;
            }
            iVar9 = iVar9 + uVar12;
            uVar26 = (((int)((uint)bVar25 - (uint)bVar22) >> bVar16 & 0xffffU) >>
                      ((byte)uVar17 & 0x1f) & ~(-1 << ((byte)uVar12 & 0x1f))) << 8;
            bVar24 = (byte)(uVar26 >> ((byte)iVar9 & 0x1f)) | (byte)uVar27;
            uVar27 = (uint)bVar24;
            *outData = bVar24;
            if (7 < (ushort)iVar9) {
              iVar9 = iVar9 + -8;
              uVar27 = uVar26 >> ((byte)iVar9 & 0x1f);
              outData[1] = (byte)uVar27;
              outData = outData + 1;
            }
            uVar21 = uVar21 - uVar12;
            uVar17 = (uVar17 & 0xffff) + (uVar12 & 0xffff);
          } while ((short)uVar21 != 0);
        }
        inData = inData + 1;
      } while (inData < pbVar1);
      return '\0';
    }
    pPVar4 = cmprInfo->comprTbl;
    srcLen = pPVar4->valueCount;
    if (srcLen == 0) {
      return '\x10';
    }
    if (bVar18 != pPVar4->bitsDec) {
      return '\x11';
    }
    if (bVar2 != pPVar4->bitsCmp) {
      return '\x11';
    }
    local_50 = (UINT16 *)malloc(uVar10 & 0xffff);
    local_38 = (UINT16)uVar10;
    GenerateReverseLUT_8(local_38,(UINT8 *)local_50,srcLen,(pPVar4->values).d8);
    uVar27 = (uint)((uVar13 << 3) / (ulong)bVar2);
    if (uVar27 < inLen) {
      inLen = uVar27;
    }
    if (inLen != 0) {
      pUVar28 = inData + inLen;
      iVar9 = 0;
      do {
        uVar5 = cmprInfo->comprTbl->valueCount;
        uVar27 = 0;
        if ((ulong)uVar5 != 0) {
          uVar13 = 0;
          do {
            if (*inData == (cmprInfo->comprTbl->values).d8[uVar13]) goto LAB_0010fcab;
            uVar13 = uVar13 + 1;
          } while (uVar5 != uVar13);
          uVar13 = (ulong)uVar5;
LAB_0010fcab:
          uVar27 = (uint)uVar13 & 0xffff;
        }
        bVar18 = (byte)(-0x100 >> ((byte)iVar9 & 0x1f)) & *outData;
        uVar21 = (uint)bVar18;
        *outData = bVar18;
        if (bVar2 != 0) {
          uVar12 = 0;
          uVar17 = uVar8;
          do {
            uVar26 = 8;
            if ((ushort)uVar17 < 8) {
              uVar26 = uVar17;
            }
            iVar9 = iVar9 + uVar26;
            uVar20 = (uVar27 >> ((byte)uVar12 & 0x1f) & ~(-1 << ((byte)uVar26 & 0x1f))) << 8;
            bVar18 = (byte)(uVar20 >> ((byte)iVar9 & 0x1f)) | (byte)uVar21;
            uVar21 = (uint)bVar18;
            *outData = bVar18;
            if (7 < (ushort)iVar9) {
              iVar9 = iVar9 + -8;
              uVar21 = uVar20 >> ((byte)iVar9 & 0x1f);
              outData[1] = (byte)uVar21;
              outData = outData + 1;
            }
            uVar17 = uVar17 - uVar26;
            uVar12 = (uVar12 & 0xffff) + (uVar26 & 0xffff);
          } while ((short)uVar17 != 0);
        }
        inData = inData + 1;
      } while (inData < pUVar28);
    }
  }
  if (local_50 != (UINT16 *)0x0) {
    free(local_50);
  }
  return '\0';
}

Assistant:

UINT8 CompressDataBlk(UINT32 outLen, UINT8* outData, UINT32 inLen, const UINT8* inData, const PCM_CMP_INF* cmprInfo)
{
	UINT8 valSize;
	UINT8 retVal;
	
	switch(cmprInfo->comprType)
	{
	case 0x00:	// Bit Packing compression
		valSize = (cmprInfo->bitsDec + 7) / 8;
		if (valSize == 0x01)
			retVal = Compress_BitPacking_8(outLen, outData, inLen, inData, cmprInfo);
		else if (valSize == 0x02)
			retVal = Compress_BitPacking_16(outLen, outData, inLen, inData, cmprInfo);
		else
			retVal = 0x20;	// invalid number of decompressed bits
		if (retVal)
			return retVal;
		break;
	default:
		return 0x80;
	}
	
	return 0x00;
}